

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O1

int attlist4(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  
  iVar1 = 0x21;
  if (tok == 0xf) {
    return 0x21;
  }
  if (tok == 0x18) {
    pcVar2 = attlist8;
  }
  else if (tok == 0x15) {
    pcVar2 = attlist3;
  }
  else {
    iVar1 = -1;
    pcVar2 = error;
    if ((tok == 0x1c) && (state->documentEntity == 0)) {
      return 0x3b;
    }
  }
  state->handler = pcVar2;
  return iVar1;
}

Assistant:

static int PTRCALL
attlist4(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
         const ENCODING *enc) {
  UNUSED_P(ptr);
  UNUSED_P(end);
  UNUSED_P(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ATTLIST_NONE;
  case XML_TOK_CLOSE_PAREN:
    state->handler = attlist8;
    return XML_ROLE_ATTLIST_NONE;
  case XML_TOK_OR:
    state->handler = attlist3;
    return XML_ROLE_ATTLIST_NONE;
  }
  return common(state, tok);
}